

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineOrder.cpp
# Opt level: O2

void testLineOrder(string *tempDir)

{
  half *phVar1;
  float fVar2;
  _Alloc_hider __filename;
  byte bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  half *phVar8;
  int *piVar9;
  char *pcVar10;
  Box<Imath_3_2::Vec2<int>_> *pBVar11;
  Box<Imath_3_2::Vec2<int>_> *pBVar12;
  float *pfVar13;
  float *pfVar14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  half *phVar22;
  int i;
  long lVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  FrameBuffer fb;
  Array2D<Imath_3_2::half> ph;
  Array2D<Imath_3_2::half> ph2;
  int local_e0;
  int local_d8;
  string filename;
  InputFile in;
  OutputFile out;
  Header hdr;
  
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "Testing line order and random access to scan lines");
  std::endl<char,std::char_traits<char>>(poVar7);
  ph._sizeX = 0x61;
  ph._sizeY = 0x75;
  phVar8 = (half *)operator_new__(0x58aa);
  iVar18 = 0;
  ph._data = phVar8;
  for (uVar24 = 0; uVar24 != 0x61; uVar24 = uVar24 + 1) {
    iVar21 = iVar18 + (int)((uVar24 & 0xffffffff) / 0x11) * -0xaa;
    uVar26 = 0;
    lVar23 = 0;
    while( true ) {
      if (lVar23 == 0xea) break;
      Imath_3_2::half::operator=
                ((half *)((long)&phVar8->_h + lVar23),(float)(iVar21 + (int)(uVar26 / 10) * -10));
      lVar23 = lVar23 + 2;
      iVar21 = iVar21 + 1;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
    phVar8 = phVar8 + 0x75;
    iVar18 = iVar18 + 10;
  }
  bVar3 = IlmThread_3_2::supportsThreads();
  iVar18 = 0;
  do {
    if (iVar18 == (uint)bVar3 + (uint)bVar3 * 2 + 1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar7);
      Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&ph);
      return;
    }
    cVar4 = IlmThread_3_2::supportsThreads();
    if (cVar4 != '\0') {
      Imf_3_2::setGlobalThreadCount(iVar18);
      poVar7 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar21 = Imf_3_2::globalThreadCount();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar21);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::operator+(&filename,tempDir,"imf_test_lorder.exr");
    for (iVar21 = 0; __filename._M_p = filename._M_dataplus._M_p, iVar21 != 2; iVar21 = iVar21 + 1)
    {
      poVar7 = std::operator<<((ostream *)&std::cout,"line order ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar21);
      std::operator<<(poVar7,":");
      std::ostream::flush();
      _out = 0;
      Imf_3_2::Header::Header(&hdr,0x75,0x61,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar9 = (int *)Imf_3_2::Header::lineOrder();
      *piVar9 = iVar21;
      pcVar10 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar10,(Channel *)0x1abe24);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice((Slice *)&out,HALF,(char *)ph._data,2,0xea,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
      std::operator<<((ostream *)&std::cout," writing");
      std::ostream::flush();
      remove(__filename._M_p);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar6);
      Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_2::OutputFile::writePixels((int)&out);
      Imf_3_2::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      std::operator<<((ostream *)&std::cout," reading");
      std::ostream::flush();
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile(&in,__filename._M_p,iVar6);
      Imf_3_2::InputFile::header();
      piVar9 = (int *)Imf_3_2::Header::dataWindow();
      iVar6 = *piVar9;
      lVar19 = (long)piVar9[2] - (long)iVar6;
      lVar23 = lVar19 + 1;
      iVar25 = piVar9[1];
      lVar20 = (long)piVar9[3] - (long)iVar25;
      Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&ph2,lVar20 + 1,lVar23);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph2._data + (-(long)iVar25 * ph2._sizeY - (long)iVar6))
                 ,2,lVar23 * 2,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
      Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&in);
      for (iVar6 = 0; iVar6 != 7; iVar6 = iVar6 + 1) {
        for (iVar25 = piVar9[1] + iVar6; iVar25 <= piVar9[3]; iVar25 = iVar25 + 7) {
          Imf_3_2::InputFile::readPixels((int)&in);
        }
      }
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      Imf_3_2::InputFile::header();
      pBVar11 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
      pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar11,pBVar12);
      if (!bVar5) {
        __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x81,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pBVar11 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
      pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar11,pBVar12);
      if (!bVar5) {
        __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x82,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar13 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar2 = *pfVar13;
      pfVar13 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar2 != *pfVar13) || (NAN(fVar2) || NAN(*pfVar13))) {
        __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x83,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar13 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar14 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar13 != *pfVar14) || (NAN(*pfVar13) || NAN(*pfVar14))) ||
          (pfVar13[1] != pfVar14[1])) || (NAN(pfVar13[1]) || NAN(pfVar14[1]))) {
        __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x85,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar13 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar2 = *pfVar13;
      pfVar13 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar2 != *pfVar13) || (NAN(fVar2) || NAN(*pfVar13))) {
        __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x86,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      piVar9 = (int *)Imf_3_2::Header::lineOrder();
      iVar6 = *piVar9;
      piVar9 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar6 != *piVar9) {
        __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x87,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      piVar9 = (int *)Imf_3_2::Header::compression();
      iVar6 = *piVar9;
      piVar9 = (int *)Imf_3_2::Header::compression();
      if (iVar6 != *piVar9) {
        __assert_fail("in.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x88,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::Header::channels();
      p_Var15 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::channels();
      p_Var16 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      while( true ) {
        Imf_3_2::Header::channels();
        p_Var17 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
        if (p_Var15 == p_Var17) break;
        iVar6 = strcmp((char *)(p_Var15 + 1),(char *)(p_Var16 + 1));
        if (iVar6 != 0) {
          __assert_fail("!strcmp (hi.name (), ii.name ())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x8f,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (p_Var15[9]._M_color != p_Var16[9]._M_color) {
          __assert_fail("hi.channel ().type == ii.channel ().type",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x90,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (*(int *)&p_Var15[9].field_0x4 != *(int *)&p_Var16[9].field_0x4) {
          __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x91,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (*(int *)&p_Var15[9]._M_parent != *(int *)&p_Var16[9]._M_parent) {
          __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x92,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      }
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::channels();
      p_Var15 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var16 != p_Var15) {
        __assert_fail("ii == in.header ().channels ().end ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x98,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      local_d8 = (int)lVar19;
      local_e0 = (int)lVar20;
      phVar8 = ph._data;
      phVar22 = ph2._data;
      for (lVar23 = 0; lVar23 <= local_e0; lVar23 = lVar23 + 1) {
        lVar19 = 0;
        while (lVar19 <= local_d8) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar8[lVar19]._h * 4);
          phVar1 = phVar22 + lVar19;
          lVar19 = lVar19 + 1;
          pfVar13 = (float *)(_imath_half_to_float_table + (ulong)phVar1->_h * 4);
          if ((fVar2 != *pfVar13) || (NAN(fVar2) || NAN(*pfVar13))) {
            __assert_fail("ph1[y][x] == ph2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                          ,0x9c,
                          "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                         );
          }
        }
        phVar22 = phVar22 + ph2._sizeY;
        phVar8 = phVar8 + ph._sizeY;
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&ph2);
      Imf_3_2::InputFile::~InputFile(&in);
      remove(__filename._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_3_2::Header::~Header(&hdr);
    }
    std::__cxx11::string::~string((string *)&filename);
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

void
testLineOrder (const std::string& tempDir)
{
    try
    {
        cout << "Testing line order and random access to scan lines" << endl;

        const int W = 117;
        const int H = 97;

        Array2D<half> ph (H, W);
        fillPixels (ph, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            std::string filename = tempDir + "imf_test_lorder.exr";

            for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
            {
                writeRead (ph, filename.c_str (), W, H, LineOrder (lorder));
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}